

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

bool basisu::string_split_path(char *p,string *pDrive,string *pDir,string *pFilename,string *pExt)

{
  char *pcVar1;
  char *pcVar2;
  char nametmp [1024];
  char dirtmp [1024];
  string sStack_858;
  char local_838 [1024];
  char local_438 [1032];
  
  strcpy_safe(local_438,0x400,p);
  strcpy_safe(local_838,0x400,p);
  if (pDrive != (string *)0x0) {
    std::__cxx11::string::resize((ulong)pDrive);
  }
  pcVar1 = dirname(local_438);
  pcVar2 = __xpg_basename(local_838);
  if (pcVar2 != (char *)0x0 && pcVar1 != (char *)0x0) {
    if (pDir != (string *)0x0) {
      std::__cxx11::string::assign((char *)pDir);
      if ((pDir->_M_string_length != 0) &&
         ((pDir->_M_dataplus)._M_p[pDir->_M_string_length - 1] != '/')) {
        std::__cxx11::string::append((char *)pDir);
      }
    }
    if (pFilename != (string *)0x0) {
      std::__cxx11::string::assign((char *)pFilename);
      string_remove_extension(pFilename);
    }
    if (pExt != (string *)0x0) {
      std::__cxx11::string::assign((char *)pExt);
      string_get_extension(&sStack_858,pExt);
      std::__cxx11::string::operator=((string *)pExt,(string *)&sStack_858);
      std::__cxx11::string::~string((string *)&sStack_858);
      if (pExt->_M_string_length != 0) {
        std::operator+(&sStack_858,".",pExt);
        std::__cxx11::string::operator=((string *)pExt,(string *)&sStack_858);
        std::__cxx11::string::~string((string *)&sStack_858);
      }
    }
  }
  return pcVar2 != (char *)0x0 && pcVar1 != (char *)0x0;
}

Assistant:

inline bool string_split_path(const char *p, std::string *pDrive, std::string *pDir, std::string *pFilename, std::string *pExt)
	{
#ifdef _MSC_VER
		char drive_buf[_MAX_DRIVE] = { 0 };
		char dir_buf[_MAX_DIR] = { 0 };
		char fname_buf[_MAX_FNAME] = { 0 };
		char ext_buf[_MAX_EXT] = { 0 };

		errno_t error = _splitpath_s(p, 
			pDrive ? drive_buf : NULL, pDrive ? _MAX_DRIVE : 0,
			pDir ? dir_buf : NULL, pDir ? _MAX_DIR : 0,
			pFilename ? fname_buf : NULL, pFilename ? _MAX_FNAME : 0,
			pExt ? ext_buf : NULL, pExt ? _MAX_EXT : 0);
		if (error != 0)
			return false;

		if (pDrive) *pDrive = drive_buf;
		if (pDir) *pDir = dir_buf;
		if (pFilename) *pFilename = fname_buf;
		if (pExt) *pExt = ext_buf;
		return true;
#else
		char dirtmp[1024], nametmp[1024];
		strcpy_safe(dirtmp, sizeof(dirtmp), p);
		strcpy_safe(nametmp, sizeof(nametmp), p);

		if (pDrive)
			pDrive->resize(0);

		const char *pDirName = dirname(dirtmp);
		const char* pBaseName = basename(nametmp);
		if ((!pDirName) || (!pBaseName))
			return false;

		if (pDir)
		{
			*pDir = pDirName;
			if ((pDir->size()) && (pDir->back() != '/'))
				*pDir += "/";
		}
				
		if (pFilename)
		{
			*pFilename = pBaseName;
			string_remove_extension(*pFilename);
		}

		if (pExt)
		{
			*pExt = pBaseName;
			*pExt = string_get_extension(*pExt);
			if (pExt->size())
				*pExt = "." + *pExt;
		}

		return true;
#endif
	}